

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestOneof_FooGroup * __thiscall
proto2_unittest::TestOneof::_internal_mutable_foogroup(TestOneof *this)

{
  TestAllTypes *pTVar1;
  Arena *arena;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 4) {
    pTVar1 = (this->field_0)._impl_.foo_.foo_message_;
  }
  else {
    clear_foo(this);
    (this->field_0)._impl_._oneof_case_[0] = 4;
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pTVar1 = (TestAllTypes *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestOneof_FooGroup>(arena);
    (this->field_0)._impl_.foo_.foo_message_ = pTVar1;
  }
  return (TestOneof_FooGroup *)pTVar1;
}

Assistant:

inline ::proto2_unittest::TestOneof_FooGroup* PROTOBUF_NONNULL TestOneof::_internal_mutable_foogroup() {
  if (foo_case() != kFoogroup) {
    clear_foo();
    set_has_foogroup();
    _impl_.foo_.foogroup_ = 
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestOneof_FooGroup>(GetArena());
  }
  return _impl_.foo_.foogroup_;
}